

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O0

StandardNeeded __thiscall
anon_unknown.dwarf_1186e0a::StandardLevelComputer::HighestStandardNeeded
          (StandardLevelComputer *this,cmMakefile *makefile,string *feature)

{
  string_view arg;
  cmValue cVar1;
  bool bVar2;
  undefined4 uVar3;
  string *psVar4;
  const_reference str;
  const_reference pvVar5;
  undefined1 local_160 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  cmAlphaNum local_108;
  string local_d8;
  cmValue local_b8;
  cmValue prop;
  size_t i;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string prefix;
  string *feature_local;
  cmMakefile *makefile_local;
  StandardLevelComputer *this_local;
  StandardNeeded maxLevel;
  
  prefix.field_2._8_8_ = feature;
  cmAlphaNum::cmAlphaNum(&local_78,"CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&i,&this->Language);
  cmStrCat<>((string *)local_48,&local_78,(cmAlphaNum *)&i);
  this_local = (StandardLevelComputer *)0xffffffffffffffff;
  for (prop.Value = (string *)0x0; cVar1.Value = prop.Value,
      psVar4 = (string *)std::vector<int,_std::allocator<int>_>::size(&this->Levels),
      cVar1.Value < psVar4; prop.Value = (string *)&(prop.Value)->field_0x1) {
    cmAlphaNum::cmAlphaNum(&local_108,(string *)local_48);
    str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&this->LevelsAsStrings,(size_type)prop.Value);
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)
               &props.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,str);
    cmStrCat<char[18]>(&local_d8,&local_108,
                       (cmAlphaNum *)
                       &props.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [18])0xde14be);
    local_b8 = cmMakefile::GetDefinition(makefile,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    bVar2 = cmValue::operator_cast_to_bool(&local_b8);
    if (bVar2) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_b8);
      arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_160,arg,false);
      bVar2 = ::cm::
              contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_160,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         prefix.field_2._8_8_);
      if (bVar2) {
        uVar3 = SUB84(prop.Value,0);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->Levels,(size_type)prop.Value);
        this_local = (StandardLevelComputer *)CONCAT44(*pvVar5,uVar3);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_160);
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return (StandardNeeded)this_local;
}

Assistant:

StandardNeeded HighestStandardNeeded(cmMakefile* makefile,
                                       std::string const& feature) const
  {
    std::string prefix = cmStrCat("CMAKE_", this->Language);
    StandardNeeded maxLevel = { -1, -1 };
    for (size_t i = 0; i < this->Levels.size(); ++i) {
      if (cmValue prop = makefile->GetDefinition(
            cmStrCat(prefix, this->LevelsAsStrings[i], "_COMPILE_FEATURES"))) {
        std::vector<std::string> props = cmExpandedList(*prop);
        if (cm::contains(props, feature)) {
          maxLevel = { static_cast<int>(i), this->Levels[i] };
        }
      }
    }
    return maxLevel;
  }